

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void RenderViewportsThumbnails(void)

{
  ImGuiContext *pIVar1;
  ImGuiViewportP **ppIVar2;
  ImVec2 *pIVar3;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  undefined1 local_78 [8];
  ImRect viewport_draw_bb;
  ImGuiViewportP *viewport;
  ImVec2 IStack_58;
  int n_1;
  ImVec2 local_50;
  ImVec2 off;
  ImVec2 p;
  int local_30;
  undefined1 local_2c [4];
  int n;
  ImRect bb_full;
  float SCALE;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  unique0x00012000 = GImGui->CurrentWindow;
  bb_full.Max.x = 0.125;
  ImRect::ImRect((ImRect *)local_2c,3.4028235e+38,3.4028235e+38,-3.4028235e+38,-3.4028235e+38);
  for (local_30 = 0; local_30 < (pIVar1->Viewports).Size; local_30 = local_30 + 1) {
    ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](&pIVar1->Viewports,local_30);
    _p = ImGuiViewportP::GetMainRect(*ppIVar2);
    ImRect::Add((ImRect *)local_2c,(ImRect *)&p);
  }
  off = (stack0xffffffffffffffe8->DC).CursorPos;
  IStack_58 = operator*((ImVec2 *)local_2c,bb_full.Max.x);
  local_50 = operator-(&off,&stack0xffffffffffffffa8);
  for (viewport._4_4_ = 0; viewport._4_4_ < (pIVar1->Viewports).Size;
      viewport._4_4_ = viewport._4_4_ + 1) {
    pIVar3 = (ImVec2 *)ImVector<ImGuiViewportP_*>::operator[](&pIVar1->Viewports,viewport._4_4_);
    viewport_draw_bb.Max = *pIVar3;
    local_88 = operator*((ImVec2 *)((long)viewport_draw_bb.Max + 4),bb_full.Max.x);
    local_80 = operator+(&local_50,&local_88);
    local_a0 = operator+((ImVec2 *)((long)viewport_draw_bb.Max + 4),
                         (ImVec2 *)((long)viewport_draw_bb.Max + 0xc));
    local_98 = operator*(&local_a0,bb_full.Max.x);
    local_90 = operator+(&local_50,&local_98);
    ImRect::ImRect((ImRect *)local_78,&local_80,&local_90);
    ImGui::DebugRenderViewportThumbnail
              (stack0xffffffffffffffe8->DrawList,(ImGuiViewportP *)viewport_draw_bb.Max,
               (ImRect *)local_78);
  }
  local_b0 = ImRect::GetSize((ImRect *)local_2c);
  local_a8 = operator*(&local_b0,bb_full.Max.x);
  ImGui::Dummy(&local_a8);
  return;
}

Assistant:

static void RenderViewportsThumbnails()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We don't display full monitor bounds (we could, but it often looks awkward), instead we display just enough to cover all of our viewports.
    float SCALE = 1.0f / 8.0f;
    ImRect bb_full(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        bb_full.Add(g.Viewports[n]->GetMainRect());
    ImVec2 p = window->DC.CursorPos;
    ImVec2 off = p - bb_full.Min * SCALE;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        ImRect viewport_draw_bb(off + (viewport->Pos) * SCALE, off + (viewport->Pos + viewport->Size) * SCALE);
        ImGui::DebugRenderViewportThumbnail(window->DrawList, viewport, viewport_draw_bb);
    }
    ImGui::Dummy(bb_full.GetSize() * SCALE);
}